

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O1

ActionMessage * __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
::pop(ActionMessage *__return_storage_ptr__,
     BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  bool bVar1;
  SmallBuffer *pSVar2;
  _Elt_pointer act;
  pointer pAVar3;
  ActionMessage *this_00;
  _Optional_payload_base<helics::ActionMessage> *this_01;
  bool bVar4;
  unique_lock<std::mutex> pullLock;
  unique_lock<std::mutex> local_1c8;
  unique_lock *local_1b8;
  _Optional_payload_base<helics::ActionMessage> local_1b0;
  _Optional_payload_base<helics::ActionMessage> local_f0;
  
  __return_storage_ptr__->messageAction = cmd_ignore;
  __return_storage_ptr__->messageID = 0;
  __return_storage_ptr__->source_id = 0;
  __return_storage_ptr__->source_handle = -1700000000;
  __return_storage_ptr__->dest_id = 0;
  __return_storage_ptr__->dest_handle = -1700000000;
  __return_storage_ptr__->counter = 0;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->sequenceID = 0;
  (__return_storage_ptr__->actionTime).internalTimeCode = 0;
  (__return_storage_ptr__->Te).internalTimeCode = 0;
  (__return_storage_ptr__->Tdemin).internalTimeCode = 0;
  (__return_storage_ptr__->Tso).internalTimeCode = 0;
  (__return_storage_ptr__->payload).buffer._M_elems[0] = 0;
  (__return_storage_ptr__->payload).buffer._M_elems[1] = 0;
  (__return_storage_ptr__->payload).buffer._M_elems[2] = 0;
  (__return_storage_ptr__->payload).buffer._M_elems[3] = 0;
  (__return_storage_ptr__->payload).buffer._M_elems[4] = 0;
  (__return_storage_ptr__->payload).buffer._M_elems[5] = 0;
  (__return_storage_ptr__->payload).buffer._M_elems[6] = 0;
  (__return_storage_ptr__->payload).buffer._M_elems[7] = 0;
  pSVar2 = &__return_storage_ptr__->payload;
  (pSVar2->buffer)._M_elems[8] = 0;
  (pSVar2->buffer)._M_elems[9] = 0;
  (pSVar2->buffer)._M_elems[10] = 0;
  (pSVar2->buffer)._M_elems[0xb] = 0;
  (pSVar2->buffer)._M_elems[0xc] = 0;
  (pSVar2->buffer)._M_elems[0xd] = 0;
  (pSVar2->buffer)._M_elems[0xe] = 0;
  (pSVar2->buffer)._M_elems[0xf] = 0;
  pSVar2 = &__return_storage_ptr__->payload;
  (pSVar2->buffer)._M_elems[0x10] = 0;
  (pSVar2->buffer)._M_elems[0x11] = 0;
  (pSVar2->buffer)._M_elems[0x12] = 0;
  (pSVar2->buffer)._M_elems[0x13] = 0;
  (pSVar2->buffer)._M_elems[0x14] = 0;
  (pSVar2->buffer)._M_elems[0x15] = 0;
  (pSVar2->buffer)._M_elems[0x16] = 0;
  (pSVar2->buffer)._M_elems[0x17] = 0;
  pSVar2 = &__return_storage_ptr__->payload;
  (pSVar2->buffer)._M_elems[0x18] = 0;
  (pSVar2->buffer)._M_elems[0x19] = 0;
  (pSVar2->buffer)._M_elems[0x1a] = 0;
  (pSVar2->buffer)._M_elems[0x1b] = 0;
  (pSVar2->buffer)._M_elems[0x1c] = 0;
  (pSVar2->buffer)._M_elems[0x1d] = 0;
  (pSVar2->buffer)._M_elems[0x1e] = 0;
  (pSVar2->buffer)._M_elems[0x1f] = 0;
  pSVar2 = &__return_storage_ptr__->payload;
  (pSVar2->buffer)._M_elems[0x20] = 0;
  (pSVar2->buffer)._M_elems[0x21] = 0;
  (pSVar2->buffer)._M_elems[0x22] = 0;
  (pSVar2->buffer)._M_elems[0x23] = 0;
  (pSVar2->buffer)._M_elems[0x24] = 0;
  (pSVar2->buffer)._M_elems[0x25] = 0;
  (pSVar2->buffer)._M_elems[0x26] = 0;
  (pSVar2->buffer)._M_elems[0x27] = 0;
  pSVar2 = &__return_storage_ptr__->payload;
  (pSVar2->buffer)._M_elems[0x28] = 0;
  (pSVar2->buffer)._M_elems[0x29] = 0;
  (pSVar2->buffer)._M_elems[0x2a] = 0;
  (pSVar2->buffer)._M_elems[0x2b] = 0;
  (pSVar2->buffer)._M_elems[0x2c] = 0;
  (pSVar2->buffer)._M_elems[0x2d] = 0;
  (pSVar2->buffer)._M_elems[0x2e] = 0;
  (pSVar2->buffer)._M_elems[0x2f] = 0;
  pSVar2 = &__return_storage_ptr__->payload;
  (pSVar2->buffer)._M_elems[0x30] = 0;
  (pSVar2->buffer)._M_elems[0x31] = 0;
  (pSVar2->buffer)._M_elems[0x32] = 0;
  (pSVar2->buffer)._M_elems[0x33] = 0;
  (pSVar2->buffer)._M_elems[0x34] = 0;
  (pSVar2->buffer)._M_elems[0x35] = 0;
  (pSVar2->buffer)._M_elems[0x36] = 0;
  (pSVar2->buffer)._M_elems[0x37] = 0;
  pSVar2 = &__return_storage_ptr__->payload;
  (pSVar2->buffer)._M_elems[0x38] = 0;
  (pSVar2->buffer)._M_elems[0x39] = 0;
  (pSVar2->buffer)._M_elems[0x3a] = 0;
  (pSVar2->buffer)._M_elems[0x3b] = 0;
  (pSVar2->buffer)._M_elems[0x3c] = 0;
  (pSVar2->buffer)._M_elems[0x3d] = 0;
  (pSVar2->buffer)._M_elems[0x3e] = 0;
  (pSVar2->buffer)._M_elems[0x3f] = 0;
  (__return_storage_ptr__->payload).bufferSize = 0;
  (__return_storage_ptr__->payload).bufferCapacity = 0x40;
  (__return_storage_ptr__->payload).heap = (byte *)&__return_storage_ptr__->payload;
  (__return_storage_ptr__->payload).nonOwning = false;
  (__return_storage_ptr__->payload).locked = false;
  (__return_storage_ptr__->payload).usingAllocatedBuffer = false;
  (__return_storage_ptr__->payload).errorCondition = '\0';
  (__return_storage_ptr__->payload).userKey = 0;
  (__return_storage_ptr__->stringData).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->stringData).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->stringData).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  try_pop((optional<helics::ActionMessage> *)&local_1b0,this);
  local_1b8 = (unique_lock *)&this->condition;
  bVar4 = false;
  do {
    if (local_1b0._M_engaged != false) {
      helics::ActionMessage::operator=(__return_storage_ptr__,(ActionMessage *)&local_1b0);
      if (local_1b0._M_engaged != true) {
        return __return_storage_ptr__;
      }
      local_1b0._M_engaged = false;
      this_01 = &local_1b0;
      goto LAB_002f2c5e;
    }
    local_1c8._M_owns = false;
    local_1c8._M_device = (mutex_type *)&this->m_pullLock;
    std::unique_lock<std::mutex>::lock(&local_1c8);
    local_1c8._M_owns = true;
    act = (this->priorityQueue).c.
          super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur;
    if ((this->priorityQueue).c.
        super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur == act) {
      pAVar3 = (this->pullElements).
               super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((this->pullElements).
          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Vector_impl_data._M_start != pAVar3) {
LAB_002f2b5f:
        helics::ActionMessage::operator=(__return_storage_ptr__,pAVar3 + -1);
        this_00 = (this->pullElements).
                  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
                  _M_impl.super__Vector_impl_data._M_finish + -1;
        (this->pullElements).
        super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
        super__Vector_impl_data._M_finish = this_00;
        helics::ActionMessage::~ActionMessage(this_00);
        goto LAB_002f2b81;
      }
      std::condition_variable::wait(local_1b8);
      act = (this->priorityQueue).c.
            super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl
            .super__Deque_impl_data._M_start._M_cur;
      if ((this->priorityQueue).c.
          super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur != act) goto LAB_002f2b41;
      pAVar3 = (this->pullElements).
               super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((this->pullElements).
          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Vector_impl_data._M_start != pAVar3) goto LAB_002f2b5f;
      std::unique_lock<std::mutex>::unlock(&local_1c8);
      try_pop((optional<helics::ActionMessage> *)&local_f0,this);
      std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign(&local_1b0,&local_f0);
      if (local_f0._M_engaged == true) {
        local_f0._M_engaged = false;
        helics::ActionMessage::~ActionMessage((ActionMessage *)&local_f0);
      }
      bVar1 = true;
    }
    else {
LAB_002f2b41:
      helics::ActionMessage::operator=(__return_storage_ptr__,act);
      CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_front
                (&(this->priorityQueue).c);
LAB_002f2b81:
      bVar4 = true;
      bVar1 = false;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_1c8);
  } while (bVar1);
  if (local_1b0._M_engaged == true) {
    local_1b0._M_engaged = false;
    helics::ActionMessage::~ActionMessage((ActionMessage *)&local_1b0);
  }
  this_01 = (_Optional_payload_base<helics::ActionMessage> *)__return_storage_ptr__;
  if (!bVar4) {
LAB_002f2c5e:
    helics::ActionMessage::~ActionMessage((ActionMessage *)this_01);
  }
  return __return_storage_ptr__;
}

Assistant:

T pop()
        {
            T actval;
            auto val = try_pop();
            while (!val) {
                std::unique_lock<MUTEX> pullLock(
                    m_pullLock);  // get the lock then wait
                if (!priorityQueue.empty()) {
                    actval = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    return actval;
                }
                if (!pullElements.empty())  // make sure we are actually empty;
                {
                    actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                condition.wait(pullLock);  // now wait
                if (!priorityQueue.empty()) {
                    actval = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    return actval;
                }
                if (!pullElements.empty())  // check for spurious wake-ups
                {
                    actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                pullLock.unlock();
                val = try_pop();
            }
            // move the value out of the optional
            actval = std::move(*val);
            return actval;
        }